

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O2

int s2pred::TriageCompareLineSin2Distance<long_double>
              (Vector3<long_double> *x,Vector3<long_double> *a0,Vector3<long_double> *a1,
              longdouble r2,Vector3<long_double> *n,longdouble n1,longdouble n2)

{
  int iVar1;
  D *b;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble lVar2;
  longdouble local_88;
  Vector3<long_double> local_78;
  longdouble local_48;
  undefined4 local_3e;
  undefined2 local_3a;
  longdouble local_38;
  undefined4 local_2e;
  undefined2 local_2a;
  longdouble local_28;
  undefined4 local_1e;
  undefined2 local_1a;
  
  if ((longdouble)2.0 <= r2) {
    iVar1 = -1;
  }
  else {
    lVar2 = ((longdouble)1 + r2 * (longdouble)-0.25) * n2 * r2;
    GetClosestVertex<long_double>(&local_78,x,a0,a1,&local_88);
    local_3a = *(undefined2 *)((long)x->c_ + 0xe);
    local_3e = *(undefined4 *)((long)x->c_ + 10);
    local_2e = *(undefined4 *)((long)x->c_ + 0x1a);
    local_2a = *(undefined2 *)((long)x->c_ + 0x1e);
    local_1e = *(undefined4 *)((long)x->c_ + 0x2a);
    local_1a = *(undefined2 *)((long)x->c_ + 0x2e);
    local_48 = *(longdouble *)x->c_ - local_78.c_[0]._0_10_;
    local_38 = *(longdouble *)(x->c_ + 1) - local_78.c_[1]._0_10_;
    local_28 = *(longdouble *)(x->c_ + 2) - local_78.c_[2]._0_10_;
    util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::DotProd
              (&local_48,(BasicVector<Vector3,_long_double,_3UL> *)n,b);
    sqrtl();
    in_ST1 = (n1 * (longdouble)6.964101615137754 + (longdouble)6.153480596427404e-15) *
             (longdouble)5.421011e-20 * in_ST1;
    util::math::internal_vector::BasicVector<Vector3,_long_double,_3UL>::Norm2
              ((BasicVector<Vector3,_long_double,_3UL> *)x);
    in_ST2 = lVar2 * in_ST2;
    lVar2 = in_ST0 * in_ST0 * (longdouble)2.1684043e-19 +
            (ABS(in_ST0) + ABS(in_ST0) + in_ST1) * in_ST1 +
            lVar2 * (longdouble)3.2526065e-19 + (longdouble)2.1684043e-19 * in_ST2;
    in_ST2 = in_ST0 * in_ST0 - in_ST2;
    iVar1 = 1;
    if (in_ST2 <= lVar2) {
      iVar1 = -(uint)(in_ST2 < -lVar2);
    }
  }
  return iVar1;
}

Assistant:

int TriageCompareLineSin2Distance(const Vector3<T>& x, const Vector3<T>& a0,
                                  const Vector3<T>& a1, T r2,
                                  const Vector3<T>& n, T n1, T n2) {
  constexpr T T_ERR = rounding_epsilon<T>();

  // The minimum distance is to a point on the edge interior.  Since the true
  // distance to the edge is always less than 90 degrees, we can return
  // immediately if the limit is 90 degrees or larger.
  if (r2 >= 2.0) return -1;  // distance < limit

  // Otherwise we compute sin^2(distance to edge) to get the best accuracy
  // when the distance limit is small (e.g., S2::kIntersectionError).
  T n2sin2_r = n2 * r2 * (1 - 0.25 * r2);
  T n2sin2_r_error = 6 * T_ERR * n2sin2_r;
  T ax2, xDn = (x - GetClosestVertex(x, a0, a1, &ax2)).DotProd(n);
  T xDn2 = xDn * xDn;
  const T c1 = (((3.5 + 2 * sqrt(3)) * n1 + 32 * sqrt(3) * DBL_ERR) *
                T_ERR * sqrt(ax2));
  T xDn2_error = 4 * T_ERR * xDn2 + (2 * fabs(xDn) + c1) * c1;

  // If we are using extended precision, then it is worthwhile to recompute
  // the length of X more accurately.  Otherwise we use the fact that X is
  // guaranteed to be unit length to with a tolerance of 4 * DBL_ERR.
  if (T_ERR < DBL_ERR) {
    n2sin2_r *= x.Norm2();
    n2sin2_r_error += 4 * T_ERR * n2sin2_r;
  } else {
    n2sin2_r_error += 8 * DBL_ERR * n2sin2_r;
  }
  T diff = xDn2 - n2sin2_r;
  T error = xDn2_error + n2sin2_r_error;
  return (diff > error) ? 1 : (diff < -error) ? -1 : 0;
}